

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

int ConvexDecomposition::calchullgen(float3 *verts,int verts_count,int vlimit)

{
  float3 *b;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  cbtHullTriangle *pcVar8;
  cbtHullTriangle *pcVar9;
  int *piVar10;
  cbtHullTriangle **ppcVar11;
  int iVar12;
  char *__assertion;
  int iVar13;
  int i;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar28 [64];
  undefined1 auVar30 [60];
  undefined1 auVar29 [64];
  int4 iVar31;
  float3 fVar32;
  int3 t;
  float3 local_d0;
  float3 local_c0;
  Array<int> isextreme;
  Array<int> allow;
  float3 local_88;
  long local_78;
  cbtHullTriangle *local_70;
  cbtHullTriangle *local_68;
  cbtHullTriangle *local_60;
  ulong local_58;
  float3 local_50;
  float3 local_40;
  undefined8 uVar26;
  undefined1 auVar27 [56];
  
  iVar12 = 0;
  if (3 < verts_count) {
    local_c0.z = verts->z;
    local_c0.x = verts->x;
    local_c0.y = verts->y;
    local_d0.z = verts->z;
    local_d0.x = verts->x;
    local_d0.y = verts->y;
    Array<int>::Array(&isextreme,verts_count);
    Array<int>::Array(&allow,verts_count);
    local_58 = (ulong)(uint)vlimit;
    for (lVar14 = 0; auVar27 = in_ZMM0._8_56_, (ulong)(uint)verts_count * 0xc - lVar14 != 0;
        lVar14 = lVar14 + 0xc) {
      Array<int>::Add(&allow,1);
      Array<int>::Add(&isextreme,0);
      b = (float3 *)((long)&verts->x + lVar14);
      fVar32 = VectorMin(&local_c0,b);
      local_c0.z = fVar32.z;
      auVar17._0_8_ = fVar32._0_8_;
      auVar17._8_56_ = auVar27;
      local_c0._0_8_ = vmovlps_avx(auVar17._0_16_);
      fVar32 = VectorMax(&local_d0,b);
      local_d0.z = fVar32.z;
      in_ZMM0._0_8_ = fVar32._0_8_;
      in_ZMM0._8_56_ = auVar27;
      local_d0._0_8_ = vmovlps_avx(in_ZMM0._0_16_);
    }
    fVar2 = local_d0.x - local_c0.x;
    fVar3 = local_d0.y - local_c0.y;
    fVar4 = local_d0.z - local_c0.z;
    auVar27 = (undefined1  [56])0x0;
    iVar31 = FindSimplex(verts,verts_count,&allow);
    iVar12 = iVar31.x;
    if (iVar12 != -1) {
      fVar32 = operator+(verts + iVar12,verts + (iVar31._0_8_ >> 0x20));
      local_88.z = fVar32.z;
      auVar18._0_8_ = fVar32._0_8_;
      auVar18._8_56_ = auVar27;
      iVar5 = iVar31.z;
      local_88._0_8_ = vmovlps_avx(auVar18._0_16_);
      fVar32 = operator+(&local_88,verts + iVar5);
      t.z = (int)fVar32.z;
      auVar19._0_8_ = fVar32._0_8_;
      auVar19._8_56_ = auVar27;
      t._0_8_ = vmovlps_avx(auVar19._0_16_);
      fVar32 = operator+((float3 *)&t,verts + (iVar31._8_8_ >> 0x20));
      auVar20._0_8_ = fVar32._0_8_;
      auVar20._8_56_ = auVar27;
      auVar15._8_4_ = 0x3e800000;
      auVar15._0_8_ = 0x3e8000003e800000;
      auVar15._12_4_ = 0x3e800000;
      auVar15 = vmulps_avx512vl(auVar20._0_16_,auVar15);
      local_40.z = fVar32.z * 0.25;
      local_40._0_8_ = vmovlps_avx(auVar15);
      pcVar8 = (cbtHullTriangle *)::operator_new(0x24);
      iVar13 = iVar31.w;
      iVar6 = iVar31.y;
      cbtHullTriangle::cbtHullTriangle(pcVar8,iVar5,iVar13,iVar6);
      (pcVar8->n).x = 2;
      (pcVar8->n).y = 3;
      (pcVar8->n).z = 1;
      pcVar9 = (cbtHullTriangle *)::operator_new(0x24);
      cbtHullTriangle::cbtHullTriangle(pcVar9,iVar13,iVar5,iVar12);
      (pcVar9->n).x = 3;
      (pcVar9->n).y = 2;
      (pcVar9->n).z = 0;
      local_60 = pcVar9;
      pcVar9 = (cbtHullTriangle *)::operator_new(0x24);
      local_68 = pcVar8;
      cbtHullTriangle::cbtHullTriangle(pcVar9,iVar12,iVar6,iVar13);
      (pcVar9->n).x = 0;
      (pcVar9->n).y = 1;
      (pcVar9->n).z = 3;
      local_70 = pcVar9;
      pcVar8 = (cbtHullTriangle *)::operator_new(0x24);
      cbtHullTriangle::cbtHullTriangle(pcVar8,iVar6,iVar12,iVar5);
      (pcVar8->n).x = 1;
      (pcVar8->n).y = 0;
      (pcVar8->n).z = 2;
      fVar4 = fVar4 * fVar4;
      auVar28 = ZEXT464((uint)fVar4);
      auVar15 = ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3 + fVar4));
      auVar15 = vsqrtss_avx(auVar15,auVar15);
      fVar4 = auVar15._0_4_ * 0.001;
      auVar21 = ZEXT464((uint)fVar4);
      local_78 = iVar31._8_8_;
      piVar10 = Array<int>::operator[](&isextreme,iVar13);
      *piVar10 = 1;
      piVar10 = Array<int>::operator[](&isextreme,(int)local_78);
      *piVar10 = 1;
      piVar10 = Array<int>::operator[](&isextreme,iVar6);
      *piVar10 = 1;
      piVar10 = Array<int>::operator[](&isextreme,iVar12);
      *piVar10 = 1;
      checkit(local_68);
      checkit(local_60);
      checkit(local_70);
      checkit(pcVar8);
      iVar12 = 0;
      while( true ) {
        auVar30 = auVar28._4_60_;
        auVar27 = auVar21._8_56_;
        if ((int)tris._8_4_ <= iVar12) break;
        ppcVar11 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                             ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar12);
        pcVar8 = *ppcVar11;
        if (pcVar8 == (cbtHullTriangle *)0x0) {
          __assert_fail("t",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                        ,0x9dc,"int ConvexDecomposition::calchullgen(float3 *, int, int)");
        }
        if (-1 < pcVar8->vmax) {
          __assert_fail("t->vmax<0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                        ,0x9dd,"int ConvexDecomposition::calchullgen(float3 *, int, int)");
        }
        fVar32 = TriNormal(verts + (pcVar8->super_int3).x,verts + (pcVar8->super_int3).y,
                           verts + (pcVar8->super_int3).z);
        t.z = (int)fVar32.z;
        auVar22._0_8_ = fVar32._0_8_;
        auVar22._8_56_ = auVar27;
        t._0_8_ = vmovlps_avx(auVar22._0_16_);
        iVar5 = maxdirsterid<ConvexDecomposition::float3>(verts,verts_count,(float3 *)&t,&allow);
        pcVar8->vmax = iVar5;
        fVar32 = operator-(verts + iVar5,verts + (pcVar8->super_int3).x);
        auVar28._0_4_ = fVar32.z;
        auVar28._4_60_ = auVar30;
        auVar21._0_8_ = fVar32._0_8_;
        auVar21._8_56_ = auVar27;
        auVar15 = vmovshdup_avx(auVar21._0_16_);
        iVar12 = iVar12 + 1;
        auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * (float)t.y)),auVar21._0_16_,
                                  ZEXT416((uint)t.x));
        auVar15 = vfmadd231ss_fma(auVar15,auVar28._0_16_,ZEXT416((uint)t.z));
        pcVar8->rise = auVar15._0_4_;
      }
      fVar2 = fVar4 * 0.01;
      auVar29 = ZEXT464((uint)fVar2);
      iVar12 = vlimit + -4;
      if ((int)local_58 == 0) {
        iVar12 = 0x3b9ac9fc;
      }
      fVar3 = fVar4 * fVar4 * 0.1;
LAB_00e2acf3:
      if (0 < iVar12) {
        auVar23 = ZEXT464((uint)fVar4);
        pcVar8 = extrudable(fVar4);
        if (pcVar8 != (cbtHullTriangle *)0x0) {
          iVar5 = pcVar8->vmax;
          piVar10 = Array<int>::operator[](&isextreme,iVar5);
          if (*piVar10 != 0) {
            __assert_fail("!isextreme[v]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x9e8,"int ConvexDecomposition::calchullgen(float3 *, int, int)");
          }
          piVar10 = Array<int>::operator[](&isextreme,iVar5);
          *piVar10 = 1;
          iVar13 = tris._8_4_;
          while (iVar13 = iVar13 + -1, iVar6 = tris._8_4_, iVar13 != -1) {
            ppcVar11 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                                 ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar13);
            if (*ppcVar11 != (cbtHullTriangle *)0x0) {
              ppcVar11 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                                   ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar13);
              pcVar8 = *ppcVar11;
              auVar23 = ZEXT464((uint)fVar2);
              t.x = (pcVar8->super_int3).x;
              t.y = (pcVar8->super_int3).y;
              t.z = (pcVar8->super_int3).z;
              iVar6 = above(verts,&t,verts + iVar5,fVar2);
              if (iVar6 != 0) {
                ppcVar11 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                                     ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar13);
                extrude(*ppcVar11,iVar5);
              }
            }
          }
LAB_00e2adda:
          do {
            i = iVar6 + -1;
            iVar13 = tris._8_4_;
            if (iVar6 == 0) goto LAB_00e2af0b;
            ppcVar11 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                                 ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,i);
            iVar6 = i;
            if (*ppcVar11 != (cbtHullTriangle *)0x0) {
              ppcVar11 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                                   ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,i);
              iVar7 = hasvert(&(*ppcVar11)->super_int3,iVar5);
              iVar13 = tris._8_4_;
              if (iVar7 == 0) goto LAB_00e2af0b;
              ppcVar11 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                                   ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,i);
              pcVar8 = *ppcVar11;
              auVar23 = ZEXT464((uint)fVar2);
              t.x = (pcVar8->super_int3).x;
              t.y = (pcVar8->super_int3).y;
              t.z = (pcVar8->super_int3).z;
              iVar13 = above(verts,&t,&local_40,fVar2);
              auVar27 = auVar23._8_56_;
              if (iVar13 == 0) {
                lVar14 = (long)t.y;
                fVar32 = operator-(verts + lVar14,verts + t.x);
                local_88.z = fVar32.z;
                auVar24._0_8_ = fVar32._0_8_;
                auVar24._8_56_ = auVar27;
                local_88._0_8_ = vmovlps_avx(auVar24._0_16_);
                fVar32 = operator-(verts + t.z,verts + lVar14);
                uVar26 = auVar27._0_8_;
                local_50.z = fVar32.z;
                auVar25._0_8_ = fVar32._0_8_;
                auVar25._8_56_ = auVar27;
                local_50._0_8_ = vmovlps_avx(auVar25._0_16_);
                fVar32 = cross(&local_88,&local_50);
                auVar16._0_4_ = fVar32.x * fVar32.x;
                auVar16._4_4_ = fVar32.y * fVar32.y;
                auVar16._8_4_ = (float)uVar26 * (float)uVar26;
                fVar1 = (float)((ulong)uVar26 >> 0x20);
                auVar16._12_4_ = fVar1 * fVar1;
                auVar15 = vhaddps_avx(auVar16,auVar16);
                auVar29 = ZEXT464((uint)fVar3);
                auVar15 = ZEXT416((uint)(fVar32.z * fVar32.z + auVar15._0_4_));
                auVar15 = vsqrtss_avx(auVar15,auVar15);
                auVar23 = ZEXT1664(auVar15);
                if (fVar3 <= auVar15._0_4_) goto LAB_00e2adda;
              }
              ppcVar11 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                                   ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,i);
              ppcVar11 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                                   ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,
                                    ((*ppcVar11)->n).x);
              pcVar8 = *ppcVar11;
              if (pcVar8 == (cbtHullTriangle *)0x0) {
                __assertion = "nb";
              }
              else {
                iVar13 = hasvert(&pcVar8->super_int3,iVar5);
                if (iVar13 == 0) {
                  if (pcVar8->id < i) {
                    extrude(pcVar8,iVar5);
                    iVar6 = tris._8_4_;
                    goto LAB_00e2adda;
                  }
                  __assertion = "nb->id<j";
                }
                else {
                  __assertion = "!hasvert(*nb,v)";
                }
              }
              __assert_fail(__assertion,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                            ,0x9fe,"int ConvexDecomposition::calchullgen(float3 *, int, int)");
            }
          } while( true );
        }
      }
      iVar12 = 1;
      goto LAB_00e2afe5;
    }
    iVar12 = 0;
LAB_00e2afe5:
    Array<int>::~Array(&allow);
    Array<int>::~Array(&isextreme);
  }
  return iVar12;
LAB_00e2af0b:
  iVar13 = iVar13 + -1;
  if (iVar13 != -1) {
    ppcVar11 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                         ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,iVar13);
    auVar30 = auVar29._4_60_;
    auVar27 = auVar23._8_56_;
    pcVar8 = *ppcVar11;
    if (pcVar8 != (cbtHullTriangle *)0x0) {
      if (-1 < pcVar8->vmax) goto LAB_00e2afce;
      fVar32 = TriNormal(verts + (pcVar8->super_int3).x,verts + (pcVar8->super_int3).y,
                         verts + (pcVar8->super_int3).z);
      auVar29._0_4_ = fVar32.z;
      auVar29._4_60_ = auVar30;
      auVar23._0_8_ = fVar32._0_8_;
      auVar23._8_56_ = auVar27;
      t._0_8_ = vmovlps_avx(auVar23._0_16_);
      t.z = (int)auVar29._0_4_;
      iVar5 = maxdirsterid<ConvexDecomposition::float3>(verts,verts_count,(float3 *)&t,&allow);
      pcVar8->vmax = iVar5;
      piVar10 = Array<int>::operator[](&isextreme,iVar5);
      auVar30 = auVar29._4_60_;
      auVar27 = auVar23._8_56_;
      if (*piVar10 == 0) {
        fVar32 = operator-(verts + pcVar8->vmax,verts + (pcVar8->super_int3).x);
        auVar29._0_4_ = fVar32.z;
        auVar29._4_60_ = auVar30;
        auVar23._0_8_ = fVar32._0_8_;
        auVar23._8_56_ = auVar27;
        auVar15 = vmovshdup_avx(auVar23._0_16_);
        auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * (float)t.y)),auVar23._0_16_,
                                  ZEXT416((uint)t.x));
        auVar15 = vfmadd231ss_fma(auVar15,auVar29._0_16_,ZEXT416((uint)t.z));
        pcVar8->rise = auVar15._0_4_;
      }
      else {
        pcVar8->vmax = -1;
      }
    }
    goto LAB_00e2af0b;
  }
LAB_00e2afce:
  iVar12 = iVar12 + -1;
  goto LAB_00e2acf3;
}

Assistant:

int calchullgen(float3 *verts,int verts_count, int vlimit)
{
	if(verts_count <4) return 0;
	if(vlimit==0) vlimit=1000000000;
	int j;
	float3 bmin(*verts),bmax(*verts);
	Array<int> isextreme(verts_count);
	Array<int> allow(verts_count);
	for(j=0;j<verts_count;j++) 
	{
		allow.Add(1);
		isextreme.Add(0);
		bmin = VectorMin(bmin,verts[j]);
		bmax = VectorMax(bmax,verts[j]);
	}
	float epsilon = magnitude(bmax-bmin) * 0.001f;


	int4 p = FindSimplex(verts,verts_count,allow);
	if(p.x==-1) return 0; // simplex failed



	float3 center = (verts[p[0]]+verts[p[1]]+verts[p[2]]+verts[p[3]]) /4.0f;  // a valid interior point
	cbtHullTriangle *t0 = new cbtHullTriangle(p[2],p[3],p[1]); t0->n=int3(2,3,1);
	cbtHullTriangle *t1 = new cbtHullTriangle(p[3],p[2],p[0]); t1->n=int3(3,2,0);
	cbtHullTriangle *t2 = new cbtHullTriangle(p[0],p[1],p[3]); t2->n=int3(0,1,3);
	cbtHullTriangle *t3 = new cbtHullTriangle(p[1],p[0],p[2]); t3->n=int3(1,0,2);
	isextreme[p[0]]=isextreme[p[1]]=isextreme[p[2]]=isextreme[p[3]]=1;
	checkit(t0);checkit(t1);checkit(t2);checkit(t3);

	for(j=0;j<tris.count;j++)
	{
		cbtHullTriangle *t=tris[j];
		assert(t);
		assert(t->vmax<0);
		float3 n=TriNormal(verts[(*t)[0]],verts[(*t)[1]],verts[(*t)[2]]);
		t->vmax = maxdirsterid(verts,verts_count,n,allow);
		t->rise = dot(n,verts[t->vmax]-verts[(*t)[0]]);
	}
	cbtHullTriangle *te;
	vlimit-=4;
	while(vlimit >0 && (te=extrudable(epsilon)))
	{
		int3 ti=*te;
		int v=te->vmax;
		assert(!isextreme[v]);  // wtf we've already done this vertex
		isextreme[v]=1;
		//if(v==p0 || v==p1 || v==p2 || v==p3) continue; // done these already
		j=tris.count;
		while(j--) {
			if(!tris[j]) continue;
			int3 t=*tris[j];
			if(above(verts,t,verts[v],0.01f*epsilon)) 
			{
				extrude(tris[j],v);
			}
		}
		// now check for those degenerate cases where we have a flipped triangle or a really skinny triangle
		j=tris.count;
		while(j--)
		{
			if(!tris[j]) continue;
			if(!hasvert(*tris[j],v)) break;
			int3 nt=*tris[j];
			if(above(verts,nt,center,0.01f*epsilon)  || magnitude(cross(verts[nt[1]]-verts[nt[0]],verts[nt[2]]-verts[nt[1]]))< epsilon*epsilon*0.1f )
			{
				cbtHullTriangle *nb = tris[tris[j]->n[0]];
				assert(nb);assert(!hasvert(*nb,v));assert(nb->id<j);
				extrude(nb,v);
				j=tris.count; 
			}
		} 
		j=tris.count;
		while(j--)
		{
			cbtHullTriangle *t=tris[j];
			if(!t) continue;
			if(t->vmax>=0) break;
			float3 n=TriNormal(verts[(*t)[0]],verts[(*t)[1]],verts[(*t)[2]]);
			t->vmax = maxdirsterid(verts,verts_count,n,allow);
			if(isextreme[t->vmax]) 
			{
				t->vmax=-1; // already done that vertex - algorithm needs to be able to terminate.
			}
			else
			{
				t->rise = dot(n,verts[t->vmax]-verts[(*t)[0]]);
			}
		}
		vlimit --;
	}
	return 1;
}